

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O2

float rr::advblend::softlight(float src,float dst)

{
  float fVar1;
  float fVar2;
  
  if (src <= 0.5) {
    return dst - (1.0 - (src + src)) * dst * (1.0 - dst);
  }
  fVar2 = src + src + -1.0;
  if (0.25 < dst) {
    if (dst < 0.0) {
      fVar1 = sqrtf(dst);
    }
    else {
      fVar1 = SQRT(dst);
    }
    return fVar2 * (fVar1 - dst) + dst;
  }
  return ((dst * 16.0 + -12.0) * dst + 3.0) * fVar2 * dst + dst;
}

Assistant:

inline float softlight (float src, float dst)
{
	if (src <= 0.5f)
		return dst - (1.0f - 2.0f*src)*dst*(1.0f-dst);
	else if (dst <= 0.25f)
		return dst + (2.0f*src - 1.0f)*dst*((16.0f*dst - 12.0f)*dst + 3.0f);
	else
		return dst + (2.0f*src - 1.0f)*(deFloatSqrt(dst)-dst);
}